

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

size_t lzma_bufcpy(uint8_t *in,size_t *in_pos,size_t in_size,uint8_t *out,size_t *out_pos,
                  size_t out_size)

{
  size_t local_58;
  size_t copy_size;
  size_t out_avail;
  size_t in_avail;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  
  local_58 = out_size - *out_pos;
  if (in_size - *in_pos < local_58) {
    local_58 = in_size - *in_pos;
  }
  memcpy(out + *out_pos,in + *in_pos,local_58);
  *in_pos = local_58 + *in_pos;
  *out_pos = local_58 + *out_pos;
  return local_58;
}

Assistant:

extern size_t
lzma_bufcpy(const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size)
{
	const size_t in_avail = in_size - *in_pos;
	const size_t out_avail = out_size - *out_pos;
	const size_t copy_size = my_min(in_avail, out_avail);

	memcpy(out + *out_pos, in + *in_pos, copy_size);

	*in_pos += copy_size;
	*out_pos += copy_size;

	return copy_size;
}